

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Window * sqlite3WindowAssemble
                   (Parse *pParse,Window *pWin,ExprList *pPartition,ExprList *pOrderBy,Token *pBase)

{
  char *__src;
  char *__dest;
  ulong __n;
  
  if (pWin == (Window *)0x0) {
    if (pPartition != (ExprList *)0x0) {
      exprListDeleteNN(pParse->db,pPartition);
    }
    if (pOrderBy != (ExprList *)0x0) {
      exprListDeleteNN(pParse->db,pOrderBy);
    }
  }
  else {
    pWin->pPartition = pPartition;
    pWin->pOrderBy = pOrderBy;
    if (pBase != (Token *)0x0) {
      __src = pBase->z;
      if (__src == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        __n = (ulong)pBase->n;
        __dest = (char *)sqlite3DbMallocRawNN(pParse->db,__n + 1);
        if (__dest != (char *)0x0) {
          memcpy(__dest,__src,__n);
          __dest[__n] = '\0';
        }
      }
      pWin->zBase = __dest;
    }
  }
  return pWin;
}

Assistant:

SQLITE_PRIVATE Window *sqlite3WindowAssemble(
  Parse *pParse, 
  Window *pWin, 
  ExprList *pPartition, 
  ExprList *pOrderBy, 
  Token *pBase
){
  if( pWin ){
    pWin->pPartition = pPartition;
    pWin->pOrderBy = pOrderBy;
    if( pBase ){
      pWin->zBase = sqlite3DbStrNDup(pParse->db, pBase->z, pBase->n);
    }
  }else{
    sqlite3ExprListDelete(pParse->db, pPartition);
    sqlite3ExprListDelete(pParse->db, pOrderBy);
  }
  return pWin;
}